

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_deserialize_container
          (t_java_generator *this,ostream *out,t_type *ttype,string *prefix,bool has_metadata)

{
  int *piVar1;
  _func_int *p_Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  t_java_generator *this_00;
  string *psVar7;
  string *obj_00;
  string local_1b0;
  string obj;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  obj._M_dataplus._M_p = (pointer)&obj.field_2;
  obj._M_string_length = 0;
  obj.field_2._M_local_buf[0] = '\0';
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar4 != '\0') {
      std::__cxx11::string::string((string *)&local_130,"_set",(allocator *)&local_170);
      t_generator::tmp(&local_1b0,(t_generator *)this,&local_130);
      std::__cxx11::string::operator=((string *)&obj,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      psVar7 = &local_130;
      goto LAB_0020dd14;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar4 != '\0') {
      std::__cxx11::string::string((string *)&local_150,"_list",(allocator *)&local_170);
      t_generator::tmp(&local_1b0,(t_generator *)this,&local_150);
      std::__cxx11::string::operator=((string *)&obj,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      psVar7 = &local_150;
      goto LAB_0020dd14;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_110,"_map",(allocator *)&local_170);
    t_generator::tmp(&local_1b0,(t_generator *)this,&local_110);
    std::__cxx11::string::operator=((string *)&obj,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    psVar7 = &local_110;
LAB_0020dd14:
    std::__cxx11::string::~string((string *)psVar7);
  }
  p_Var2 = (ttype->super_t_doc)._vptr_t_doc[0x10];
  if (has_metadata) {
    iVar4 = (*p_Var2)(ttype);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar4 == '\0') goto LAB_0020dfdf;
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"org.apache.thrift.protocol.TList ");
        poVar5 = std::operator<<(poVar5,(string *)&obj);
        pcVar6 = " = iprot.readListBegin();";
      }
      else {
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"org.apache.thrift.protocol.TSet ");
        poVar5 = std::operator<<(poVar5,(string *)&obj);
        pcVar6 = " = iprot.readSetBegin();";
      }
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"org.apache.thrift.protocol.TMap ");
      poVar5 = std::operator<<(poVar5,(string *)&obj);
      pcVar6 = " = iprot.readMapBegin();";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    iVar4 = (*p_Var2)(ttype);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar4 == '\0') goto LAB_0020dfdf;
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"org.apache.thrift.protocol.TList ");
        poVar5 = std::operator<<(poVar5,(string *)&obj);
        pcVar6 = " = iprot.readListBegin(";
        poVar5 = std::operator<<(poVar5," = iprot.readListBegin(");
        type_to_enum_abi_cxx11_
                  (&local_1b0,(t_java_generator *)pcVar6,*(t_type **)&ttype[1].super_t_doc.has_doc_)
        ;
        poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
        poVar5 = std::operator<<(poVar5,");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"org.apache.thrift.protocol.TSet ");
        poVar5 = std::operator<<(poVar5,(string *)&obj);
        pcVar6 = " = iprot.readSetBegin(";
        poVar5 = std::operator<<(poVar5," = iprot.readSetBegin(");
        type_to_enum_abi_cxx11_
                  (&local_1b0,(t_java_generator *)pcVar6,*(t_type **)&ttype[1].super_t_doc.has_doc_)
        ;
        poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
        poVar5 = std::operator<<(poVar5,");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"org.apache.thrift.protocol.TMap ");
      poVar5 = std::operator<<(poVar5,(string *)&obj);
      pcVar6 = " = iprot.readMapBegin(";
      poVar5 = std::operator<<(poVar5," = iprot.readMapBegin(");
      type_to_enum_abi_cxx11_
                (&local_1b0,(t_java_generator *)pcVar6,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
      this_00 = (t_java_generator *)0x2fdaef;
      poVar5 = std::operator<<(poVar5,", ");
      type_to_enum_abi_cxx11_(&local_170,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
      poVar5 = std::operator<<(poVar5,(string *)&local_170);
      poVar5 = std::operator<<(poVar5,"); ");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_170);
    }
    std::__cxx11::string::~string((string *)&local_1b0);
  }
LAB_0020dfdf:
  if (this->reuse_objects_ == true) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"if (");
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5," == null) {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
  }
  bVar3 = is_enum_set(this,ttype);
  if (bVar3) {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_1b0);
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5," = ");
    type_name_abi_cxx11_(&local_170,this,ttype,false,true,true,false);
    poVar5 = std::operator<<(poVar5,(string *)&local_170);
    std::operator<<(poVar5,".noneOf");
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_1b0);
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5," = new ");
    type_name_abi_cxx11_(&local_170,this,ttype,false,true,false,false);
    std::operator<<(poVar5,(string *)&local_170);
  }
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar3 = is_enum_set(this,ttype);
  if ((bVar3) || (bVar3 = is_enum_map(this,ttype), bVar3)) {
    poVar5 = std::operator<<(out,"(");
    inner_enum_type_name_abi_cxx11_(&local_1b0,this,ttype);
    poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  else {
    if (this->sorted_containers_ == true) {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
      pcVar6 = "();";
      poVar5 = out;
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype), (char)iVar4 == '\0'))
      goto LAB_0020e1d9;
    }
    else {
LAB_0020e1d9:
      poVar5 = std::operator<<(out,"(");
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      pcVar6 = "2*";
      if ((char)iVar4 != '\0') {
        pcVar6 = "";
      }
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,(string *)&obj);
      poVar5 = std::operator<<(poVar5,".size");
      pcVar6 = ");";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  if (this->reuse_objects_ == true) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar4 != '\0') {
      psVar7 = &local_90;
      std::__cxx11::string::string((string *)psVar7,(string *)prefix);
      obj_00 = &local_b0;
      std::__cxx11::string::string((string *)obj_00,(string *)&obj);
      generate_deserialize_set_element(this,out,(t_set *)ttype,psVar7,obj_00,has_metadata);
      goto LAB_0020e378;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar4 != '\0') {
      psVar7 = &local_d0;
      std::__cxx11::string::string((string *)psVar7,(string *)prefix);
      obj_00 = &local_f0;
      std::__cxx11::string::string((string *)obj_00,(string *)&obj);
      generate_deserialize_list_element(this,out,(t_list *)ttype,psVar7,obj_00,has_metadata);
      goto LAB_0020e378;
    }
  }
  else {
    psVar7 = &local_50;
    std::__cxx11::string::string((string *)psVar7,(string *)prefix);
    obj_00 = &local_70;
    std::__cxx11::string::string((string *)obj_00,(string *)&obj);
    generate_deserialize_map_element(this,out,(t_map *)ttype,psVar7,obj_00,has_metadata);
LAB_0020e378:
    std::__cxx11::string::~string((string *)obj_00);
    std::__cxx11::string::~string((string *)psVar7);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if (has_metadata) {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar4 == '\0') goto LAB_0020e413;
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar6 = "iprot.readListEnd();";
      }
      else {
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar6 = "iprot.readSetEnd();";
      }
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,out);
      pcVar6 = "iprot.readMapEnd();";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
LAB_0020e413:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)&obj);
  return;
}

Assistant:

void t_java_generator::generate_deserialize_container(ostream& out,
                                                      t_type* ttype,
                                                      string prefix,
                                                      bool has_metadata) {

  scope_up(out);

  string obj;

  if (ttype->is_map()) {
    obj = tmp("_map");
  } else if (ttype->is_set()) {
    obj = tmp("_set");
  } else if (ttype->is_list()) {
    obj = tmp("_list");
  }

  if (has_metadata) {
    // Declare variables, read header
    if (ttype->is_map()) {
      indent(out) << "org.apache.thrift.protocol.TMap " << obj << " = iprot.readMapBegin();"
                  << endl;
    } else if (ttype->is_set()) {
      indent(out) << "org.apache.thrift.protocol.TSet " << obj << " = iprot.readSetBegin();"
                  << endl;
    } else if (ttype->is_list()) {
      indent(out) << "org.apache.thrift.protocol.TList " << obj << " = iprot.readListBegin();"
                  << endl;
    }
  } else {
    // Declare variables, read header
    if (ttype->is_map()) {
      indent(out) << "org.apache.thrift.protocol.TMap " << obj
                  << " = iprot.readMapBegin("
                  << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                  << type_to_enum(((t_map*)ttype)->get_val_type()) << "); "<< endl;
    } else if (ttype->is_set()) {
      indent(out) << "org.apache.thrift.protocol.TSet " << obj
                  << " = iprot.readSetBegin("
                  << type_to_enum(((t_set*)ttype)->get_elem_type()) << ");"
                  << endl;
    } else if (ttype->is_list()) {
      indent(out) << "org.apache.thrift.protocol.TList " << obj
                  << " = iprot.readListBegin("
                  << type_to_enum(((t_list*)ttype)->get_elem_type()) << ");"
                  << endl;
    }
  }

  if (reuse_objects_) {
    indent(out) << "if (" << prefix << " == null) {" << endl;
    indent_up();
  }

  if (is_enum_set(ttype)) {
    out << indent() << prefix << " = " << type_name(ttype, false, true, true) << ".noneOf";
  } else {
    out << indent() << prefix << " = new " << type_name(ttype, false, true);
  }

  // construct the collection correctly i.e. with appropriate size/type
  if (is_enum_set(ttype) || is_enum_map(ttype)) {
    out << "(" << inner_enum_type_name(ttype) << ");" << endl;
  } else if (sorted_containers_ && (ttype->is_map() || ttype->is_set())) {
    // TreeSet and TreeMap don't have any constructor which takes a capacity as an argument
    out << "();" << endl;
  } else {
    out << "(" << (ttype->is_list() ? "" : "2*") << obj << ".size"
        << ");" << endl;
  }

  if (reuse_objects_) {
    indent_down();
    indent(out) << "}" << endl;
  }

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix, obj, has_metadata);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix, obj, has_metadata);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix, obj, has_metadata);
  }

  scope_down(out);

  if (has_metadata) {
    // Read container end
    if (ttype->is_map()) {
      indent(out) << "iprot.readMapEnd();" << endl;
    } else if (ttype->is_set()) {
      indent(out) << "iprot.readSetEnd();" << endl;
    } else if (ttype->is_list()) {
      indent(out) << "iprot.readListEnd();" << endl;
    }
  }
  scope_down(out);
}